

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::Schema> __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapSchema(Node *this,uint64_t id,Reader brand)

{
  Reader brand_00;
  bool bVar1;
  Impl *pIVar2;
  Workspace *pWVar3;
  Node *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar4;
  Maybe<capnp::Schema> MVar5;
  Fault local_a8;
  Fault f;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Schema local_68 [4];
  undefined1 local_48 [24];
  Node *node;
  Node *local_28;
  Node *_node945;
  uint64_t id_local;
  Node *this_local;
  
  _node945 = in_RDX;
  id_local = id;
  this_local = this;
  pIVar2 = CompiledModule::getCompiler(*(CompiledModule **)(id + 8));
  Compiler::Impl::findNode((Impl *)&node,(uint64_t)pIVar2);
  local_48._16_8_ =
       kj::_::readMaybe<capnp::compiler::Compiler::Node>
                 ((Maybe<capnp::compiler::Compiler::Node_&> *)&node);
  local_28 = (Node *)local_48._16_8_;
  if ((Node *)local_48._16_8_ != (Node *)0x0) {
    getBootstrapSchema((Node *)local_48);
    bVar1 = kj::Maybe<capnp::Schema>::operator==((Maybe<capnp::Schema> *)local_48);
    kj::Maybe<capnp::Schema>::~Maybe((Maybe<capnp::Schema> *)local_48);
    if (bVar1) {
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this);
      aVar4 = extraout_RDX;
    }
    else {
      pIVar2 = CompiledModule::getCompiler(*(CompiledModule **)(id + 8));
      pWVar3 = Compiler::Impl::getWorkspace(pIVar2);
      memcpy(&local_98,&brand,0x30);
      Schema::Schema((Schema *)&f);
      brand_00._reader.capTable = (CapTableReader *)uStack_90;
      brand_00._reader.segment = (SegmentReader *)local_98;
      brand_00._reader.data = (void *)local_88;
      brand_00._reader.pointers = (WirePointer *)uStack_80;
      brand_00._reader.dataSize = (undefined4)local_78;
      brand_00._reader.pointerCount = local_78._4_2_;
      brand_00._reader._38_2_ = local_78._6_2_;
      brand_00._reader._40_8_ = uStack_70;
      local_68[0] = SchemaLoader::get(&pWVar3->bootstrapLoader,(uint64_t)_node945,brand_00,
                                      (Schema)f.exception);
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,local_68);
      aVar4 = extraout_RDX_00;
    }
    MVar5.ptr.field_1 = aVar4;
    MVar5.ptr._0_8_ = this;
    return (Maybe<capnp::Schema>)MVar5.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            (&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x3ba,FAILED,(char *)0x0,"\"Tried to get schema for ID we haven\'t seen before.\"",
             (char (*) [51])"Tried to get schema for ID we haven\'t seen before.");
  kj::_::Debug::Fault::fatal(&local_a8);
}

Assistant:

kj::Maybe<Schema> Compiler::Node::resolveBootstrapSchema(
    uint64_t id, schema::Brand::Reader brand) {
  KJ_IF_SOME(node, module->getCompiler().findNode(id)) {
    // Make sure the bootstrap schema is loaded into the SchemaLoader.
    if (node.getBootstrapSchema() == kj::none) {
      return kj::none;
    }

    // Now we actually invoke get() to evaluate the brand.
    return module->getCompiler().getWorkspace().bootstrapLoader.get(id, brand);
  } else {
    KJ_FAIL_REQUIRE("Tried to get schema for ID we haven't seen before.");
  }
}